

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jglp.cpp
# Opt level: O0

void __thiscall
merlin::jglp::partition
          (jglp *this,variable VX,vector<merlin::factor,_std::allocator<merlin::factor>_> *fin,
          vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
          *vin,vector<double,_std::allocator<double>_> *Norm,
          vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
          *Orig,vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                *New,flist *ids)

{
  size_t sVar1;
  size_type __n;
  bool bVar2;
  pointer ppVar3;
  reference pvVar4;
  reference this_00;
  reference pvVar5;
  variable_set *vs;
  reference pvVar6;
  reference pvVar7;
  reference puVar8;
  mapped_type *pmVar9;
  value B;
  double dVar10;
  pair<double,_merlin::jglp::sPair> local_248;
  _Base_ptr local_230;
  _Base_ptr local_228;
  _Base_ptr local_220;
  undefined1 local_218 [8];
  sPair sp_1;
  double err_1;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1f8;
  flistIt k_1;
  sPair local_1e8;
  _Base_ptr local_1d8;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1d0;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1c8;
  flistIt k;
  double mx;
  size_t jj;
  size_t ii;
  reverse_iterator top;
  sPair local_130;
  int local_11c;
  pair<double,_merlin::jglp::sPair> local_118;
  _Base_ptr local_100;
  pair<double,_merlin::jglp::sPair> local_f8;
  _Base_ptr local_e0;
  undefined1 local_d8 [8];
  sPair sp;
  double err;
  flistIt j;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_a0;
  flistIt i;
  map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
  reverseScore;
  multimap<double,_merlin::jglp::sPair,_std::less<double>,_std::allocator<std::pair<const_double,_merlin::jglp::sPair>_>_>
  scores;
  vector<double,_std::allocator<double>_> *Norm_local;
  vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_> *vin_local;
  vector<merlin::factor,_std::allocator<merlin::factor>_> *fin_local;
  jglp *this_local;
  variable VX_local;
  
  VX_local.m_label = VX.m_states;
  this_local = (jglp *)VX.m_label;
  std::
  multimap<double,_merlin::jglp::sPair,_std::less<double>,_std::allocator<std::pair<const_double,_merlin::jglp::sPair>_>_>
  ::multimap((multimap<double,_merlin::jglp::sPair,_std::less<double>,_std::allocator<std::pair<const_double,_merlin::jglp::sPair>_>_>
              *)&reverseScore._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
  ::map((map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
         *)&i);
  local_a0._M_current = (unsigned_long *)my_set<unsigned_long>::begin(ids);
  while( true ) {
    j._M_current = (unsigned_long *)my_set<unsigned_long>::end(ids);
    bVar2 = __gnu_cxx::operator!=(&local_a0,&j);
    if (!bVar2) break;
    err = (double)my_set<unsigned_long>::begin(ids);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)&err,&local_a0), bVar2) {
      puVar8 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_a0);
      sVar1 = *puVar8;
      puVar8 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)&err);
      sp.super_pair<unsigned_long,_unsigned_long>.second =
           (unsigned_long)score(this,fin,(variable *)&this_local,sVar1,*puVar8);
      puVar8 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_a0);
      sVar1 = *puVar8;
      puVar8 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)&err);
      sPair::sPair((sPair *)local_d8,sVar1,*puVar8);
      std::pair<double,_merlin::jglp::sPair>::pair<double_&,_merlin::jglp::sPair_&,_true>
                (&local_f8,(double *)&sp.super_pair<unsigned_long,_unsigned_long>.second,
                 (sPair *)local_d8);
      local_e0 = (_Base_ptr)
                 std::
                 multimap<double,merlin::jglp::sPair,std::less<double>,std::allocator<std::pair<double_const,merlin::jglp::sPair>>>
                 ::insert<std::pair<double,merlin::jglp::sPair>>
                           ((multimap<double,merlin::jglp::sPair,std::less<double>,std::allocator<std::pair<double_const,merlin::jglp::sPair>>>
                             *)&reverseScore._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            &local_f8);
      pmVar9 = std::
               map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
               ::operator[]((map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
                             *)&i,(key_type *)local_d8);
      pmVar9->_M_node = local_e0;
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)&err);
    }
    local_11c = -1;
    puVar8 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_a0);
    sVar1 = *puVar8;
    puVar8 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_a0);
    sPair::sPair(&local_130,sVar1,*puVar8);
    std::pair<double,_merlin::jglp::sPair>::pair<int,_merlin::jglp::sPair,_true>
              (&local_118,&local_11c,&local_130);
    local_100 = (_Base_ptr)
                std::
                multimap<double,merlin::jglp::sPair,std::less<double>,std::allocator<std::pair<double_const,merlin::jglp::sPair>>>
                ::insert<std::pair<double,merlin::jglp::sPair>>
                          ((multimap<double,merlin::jglp::sPair,std::less<double>,std::allocator<std::pair<double_const,merlin::jglp::sPair>>>
                            *)&reverseScore._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           &local_118);
    puVar8 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_a0);
    sVar1 = *puVar8;
    puVar8 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_a0);
    sPair::sPair((sPair *)&top,sVar1,*puVar8);
    pmVar9 = std::
             map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
             ::operator[]((map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
                           *)&i,(key_type *)&top);
    pmVar9->_M_node = local_100;
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_a0);
  }
  while( true ) {
    std::
    multimap<double,_merlin::jglp::sPair,_std::less<double>,_std::allocator<std::pair<const_double,_merlin::jglp::sPair>_>_>
    ::rbegin((multimap<double,_merlin::jglp::sPair,_std::less<double>,_std::allocator<std::pair<const_double,_merlin::jglp::sPair>_>_>
              *)&ii);
    ppVar3 = std::
             reverse_iterator<std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>
             ::operator->((reverse_iterator<std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>
                           *)&ii);
    if (ppVar3->first <= 0.0 && ppVar3->first != 0.0) break;
    ppVar3 = std::
             reverse_iterator<std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>
             ::operator->((reverse_iterator<std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>
                           *)&ii);
    jj = (ppVar3->second).super_pair<unsigned_long,_unsigned_long>.first;
    ppVar3 = std::
             reverse_iterator<std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>
             ::operator->((reverse_iterator<std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>
                           *)&ii);
    __n = (ppVar3->second).super_pair<unsigned_long,_unsigned_long>.second;
    pvVar4 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[](fin,jj);
    this_00 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[](fin,__n);
    factor::operator*=(this_00,pvVar4);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](Norm,jj);
    dVar10 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](Norm,__n);
    *pvVar5 = *pvVar5 + dVar10;
    pvVar4 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[](fin,__n);
    B = factor::max(pvVar4);
    pvVar4 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[](fin,__n);
    factor::operator/=(pvVar4,B);
    dVar10 = ::log(B);
    this->m_logz = this->m_logz + dVar10;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](Norm,__n);
    sVar1 = jj;
    *pvVar5 = *pvVar5 + dVar10;
    pvVar4 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[](fin,jj);
    vs = factor::vars(pvVar4);
    graphical_model::erase(&this->super_graphical_model,vin,sVar1,vs);
    factor::factor((factor *)&k,1.0);
    pvVar4 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[](fin,jj);
    factor::operator=(pvVar4,(factor *)&k);
    factor::~factor((factor *)&k);
    pvVar6 = std::
             vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
             ::operator[](Orig,jj);
    pvVar7 = std::
             vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
             ::operator[](Orig,__n);
    my_set<unsigned_long>::operator|=(pvVar7,pvVar6);
    pvVar6 = std::
             vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
             ::operator[](Orig,jj);
    my_set<unsigned_long>::clear(pvVar6);
    pvVar6 = std::
             vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
             ::operator[](New,jj);
    pvVar7 = std::
             vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
             ::operator[](New,__n);
    my_set<unsigned_long>::operator|=(pvVar7,pvVar6);
    pvVar6 = std::
             vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
             ::operator[](New,jj);
    my_set<unsigned_long>::clear(pvVar6);
    local_1c8._M_current = (unsigned_long *)my_set<unsigned_long>::begin(ids);
    while( true ) {
      local_1d0._M_current = (unsigned_long *)my_set<unsigned_long>::end(ids);
      bVar2 = __gnu_cxx::operator!=(&local_1c8,&local_1d0);
      sVar1 = jj;
      if (!bVar2) break;
      puVar8 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_1c8);
      sPair::sPair(&local_1e8,sVar1,*puVar8);
      pmVar9 = std::
               map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
               ::operator[]((map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
                             *)&i,&local_1e8);
      local_1d8 = pmVar9->_M_node;
      k_1._M_current =
           (unsigned_long *)
           std::
           multimap<double,merlin::jglp::sPair,std::less<double>,std::allocator<std::pair<double_const,merlin::jglp::sPair>>>
           ::erase_abi_cxx11_((multimap<double,merlin::jglp::sPair,std::less<double>,std::allocator<std::pair<double_const,merlin::jglp::sPair>>>
                               *)&reverseScore._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              (iterator)local_1d8);
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_1c8);
    }
    my_set<unsigned_long>::operator/=(ids,&jj);
    local_1f8._M_current = (unsigned_long *)my_set<unsigned_long>::begin(ids);
    while( true ) {
      err_1 = (double)my_set<unsigned_long>::end(ids);
      bVar2 = __gnu_cxx::operator!=
                        (&local_1f8,
                         (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)&err_1);
      if (!bVar2) break;
      puVar8 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_1f8);
      if (*puVar8 != __n) {
        puVar8 = __gnu_cxx::
                 __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_1f8);
        sp_1.super_pair<unsigned_long,_unsigned_long>.second =
             (unsigned_long)score(this,fin,(variable *)&this_local,__n,*puVar8);
        puVar8 = __gnu_cxx::
                 __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_1f8);
        sPair::sPair((sPair *)local_218,__n,*puVar8);
        pmVar9 = std::
                 map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
                 ::operator[]((map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
                               *)&i,(key_type *)local_218);
        local_220 = pmVar9->_M_node;
        local_228 = (_Base_ptr)
                    std::
                    multimap<double,merlin::jglp::sPair,std::less<double>,std::allocator<std::pair<double_const,merlin::jglp::sPair>>>
                    ::erase_abi_cxx11_((multimap<double,merlin::jglp::sPair,std::less<double>,std::allocator<std::pair<double_const,merlin::jglp::sPair>>>
                                        *)&reverseScore._M_t._M_impl.super__Rb_tree_header.
                                           _M_node_count,(iterator)local_220);
        std::pair<double,_merlin::jglp::sPair>::pair<double_&,_merlin::jglp::sPair_&,_true>
                  (&local_248,(double *)&sp_1.super_pair<unsigned_long,_unsigned_long>.second,
                   (sPair *)local_218);
        local_230 = (_Base_ptr)
                    std::
                    multimap<double,merlin::jglp::sPair,std::less<double>,std::allocator<std::pair<double_const,merlin::jglp::sPair>>>
                    ::insert<std::pair<double,merlin::jglp::sPair>>
                              ((multimap<double,merlin::jglp::sPair,std::less<double>,std::allocator<std::pair<double_const,merlin::jglp::sPair>>>
                                *)&reverseScore._M_t._M_impl.super__Rb_tree_header._M_node_count,
                               &local_248);
        pmVar9 = std::
                 map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
                 ::operator[]((map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
                               *)&i,(key_type *)local_218);
        pmVar9->_M_node = local_230;
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_1f8);
    }
  }
  std::
  map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
  ::~map((map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
          *)&i);
  std::
  multimap<double,_merlin::jglp::sPair,_std::less<double>,_std::allocator<std::pair<const_double,_merlin::jglp::sPair>_>_>
  ::~multimap((multimap<double,_merlin::jglp::sPair,_std::less<double>,_std::allocator<std::pair<const_double,_merlin::jglp::sPair>_>_>
               *)&reverseScore._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void jglp::partition(variable VX, std::vector<factor>& fin, std::vector<flist>& vin,
		std::vector<double>& Norm, std::vector<flist>& Orig,
		std::vector<flist>& New, flist& ids) {

	// Select allocation into buckets
	typedef std::pair<double, sPair> _INS;
	std::multimap<double, sPair> scores;
	std::map<sPair, std::multimap<double, sPair>::iterator> reverseScore;

	// Populate list of pairwise scores for aggregation
	for (flistIt i = ids.begin(); i != ids.end(); ++i) {
		for (flistIt j = ids.begin(); j != i; ++j) {
			double err = score(fin, VX, *i, *j);
			sPair sp(*i, *j);
			reverseScore[sp] = scores.insert(_INS(err, sp)); // save score
		}
		reverseScore[sPair(*i, *i)] = scores.insert(
				_INS(-1, sPair(*i, *i)));    // mark self index at -1
	}

	// Run through until no more pairs can be aggregated:
	//   Find the best pair (ii,jj) according to the scoring heuristic
	//   and join them as jj; then remove ii and re-score all pairs with jj
	for (;;) {
		std::multimap<double, sPair>::reverse_iterator top = scores.rbegin();
		if (top->first < 0)
			break;                         // if can't do any more, quit
		else {
			size_t ii = top->second.first, jj = top->second.second;
//				std::cout<<"Joining "<<ii<<","<<jj<<"; size "<<(fin[ii].vars()+fin[jj].vars()).nrStates()<<"\n";
			fin[jj] *= fin[ii];                        // combine into j
			Norm[jj] += Norm[ii];
			double mx = fin[jj].max();
			fin[jj] /= mx;
			mx = std::log(mx);
			m_logz += mx;
			Norm[jj] += mx;
			erase(vin, ii, fin[ii].vars());
			fin[ii] = factor();  //   & remove i

			Orig[jj] |= Orig[ii];
			Orig[ii].clear(); // keep track of list of original factors in this cluster
			New[jj] |= New[ii];
			New[ii].clear(); //   list of new "message" clusters incoming to this cluster

			for (flistIt k = ids.begin(); k != ids.end(); ++k) { // removing entry i => remove (i,k) for all k
				scores.erase(reverseScore[sPair(ii, *k)]);
			}

			ids /= ii;

			for (flistIt k = ids.begin(); k != ids.end(); ++k) { // updated j; rescore all pairs (j,k)
				if (*k == jj)
					continue;
				double err = score(fin, VX, jj, *k);
				sPair sp(jj, *k);
				scores.erase(reverseScore[sp]);    // change score (i,j)
				reverseScore[sp] = scores.insert(_INS(err, sp));  //
			}
		}
	}
}